

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_operator_type.cpp
# Opt level: O2

string * __thiscall
duckdb::PhysicalOperatorToString_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,PhysicalOperatorType type)

{
  char *pcVar1;
  allocator local_9;
  
  switch((int)this) {
  case 1:
    pcVar1 = "ORDER_BY";
    break;
  case 2:
    pcVar1 = "LIMIT";
    break;
  case 3:
    pcVar1 = "STREAMING_LIMIT";
    break;
  case 4:
    pcVar1 = "LIMIT_PERCENT";
    break;
  case 5:
    pcVar1 = "TOP_N";
    break;
  case 6:
    pcVar1 = "WINDOW";
    break;
  case 7:
    pcVar1 = "UNNEST";
    break;
  case 8:
    pcVar1 = "UNGROUPED_AGGREGATE";
    break;
  case 9:
    pcVar1 = "HASH_GROUP_BY";
    break;
  case 10:
    pcVar1 = "PERFECT_HASH_GROUP_BY";
    break;
  case 0xb:
    pcVar1 = "PARTITIONED_AGGREGATE";
    break;
  case 0xc:
    pcVar1 = "FILTER";
    break;
  case 0xd:
    pcVar1 = "PROJECTION";
    break;
  case 0xe:
    pcVar1 = "COPY_TO_FILE";
    break;
  case 0xf:
    pcVar1 = "BATCH_COPY_TO_FILE";
    break;
  case 0x10:
    pcVar1 = "RESERVOIR_SAMPLE";
    break;
  case 0x11:
    pcVar1 = "STREAMING_SAMPLE";
    break;
  case 0x12:
    pcVar1 = "STREAMING_WINDOW";
    break;
  case 0x13:
    pcVar1 = "PIVOT";
    break;
  case 0x14:
    pcVar1 = "COPY_DATABASE";
    break;
  case 0x15:
    pcVar1 = "TABLE_SCAN";
    break;
  case 0x16:
    pcVar1 = "DUMMY_SCAN";
    break;
  case 0x17:
    pcVar1 = "COLUMN_DATA_SCAN";
    break;
  case 0x18:
    pcVar1 = "CHUNK_SCAN";
    break;
  case 0x19:
    pcVar1 = "REC_CTE_SCAN";
    break;
  case 0x1a:
    pcVar1 = "REC_REC_CTE_SCAN";
    break;
  case 0x1b:
    pcVar1 = "CTE_SCAN";
    break;
  case 0x1c:
    pcVar1 = "DELIM_SCAN";
    break;
  case 0x1d:
    pcVar1 = "EXPRESSION_SCAN";
    break;
  case 0x1e:
    pcVar1 = "POSITIONAL_SCAN";
    break;
  case 0x1f:
    pcVar1 = "BLOCKWISE_NL_JOIN";
    break;
  case 0x20:
    pcVar1 = "NESTED_LOOP_JOIN";
    break;
  case 0x21:
    pcVar1 = "HASH_JOIN";
    break;
  case 0x22:
    pcVar1 = "CROSS_PRODUCT";
    break;
  case 0x23:
    pcVar1 = "PIECEWISE_MERGE_JOIN";
    break;
  case 0x24:
    pcVar1 = "IE_JOIN";
    break;
  case 0x25:
    pcVar1 = "LEFT_DELIM_JOIN";
    break;
  case 0x26:
    pcVar1 = "RIGHT_DELIM_JOIN";
    break;
  case 0x27:
    pcVar1 = "POSITIONAL_JOIN";
    break;
  case 0x28:
    pcVar1 = "ASOF_JOIN";
    break;
  case 0x29:
    pcVar1 = "UNION";
    break;
  case 0x2a:
    pcVar1 = "REC_CTE";
    break;
  case 0x2b:
    pcVar1 = "REC_KEY_CTE";
    break;
  case 0x2c:
    pcVar1 = "CTE";
    break;
  case 0x2d:
    pcVar1 = "INSERT";
    break;
  case 0x2e:
    pcVar1 = "BATCH_INSERT";
    break;
  case 0x2f:
    pcVar1 = "DELETE";
    break;
  case 0x30:
    pcVar1 = "UPDATE";
    break;
  case 0x31:
    pcVar1 = "CREATE_TABLE";
    break;
  case 0x32:
    pcVar1 = "CREATE_TABLE_AS";
    break;
  case 0x33:
    pcVar1 = "BATCH_CREATE_TABLE_AS";
    break;
  case 0x34:
    pcVar1 = "CREATE_INDEX";
    break;
  case 0x35:
    pcVar1 = "ALTER";
    break;
  case 0x36:
    pcVar1 = "CREATE_SEQUENCE";
    break;
  case 0x37:
    pcVar1 = "CREATE_VIEW";
    break;
  case 0x38:
    pcVar1 = "CREATE_SCHEMA";
    break;
  case 0x39:
    pcVar1 = "CREATE_MACRO";
    break;
  case 0x3a:
    pcVar1 = "DROP";
    break;
  case 0x3b:
    pcVar1 = "PRAGMA";
    break;
  case 0x3c:
    pcVar1 = "TRANSACTION";
    break;
  case 0x3d:
    pcVar1 = "CREATE_TYPE";
    break;
  case 0x3e:
    pcVar1 = "ATTACH";
    break;
  case 0x3f:
    pcVar1 = "DETACH";
    break;
  case 0x40:
    pcVar1 = "EXPLAIN";
    break;
  case 0x41:
    pcVar1 = "EXPLAIN_ANALYZE";
    break;
  case 0x42:
    pcVar1 = "EMPTY_RESULT";
    break;
  case 0x43:
    pcVar1 = "EXECUTE";
    break;
  case 0x44:
    pcVar1 = "PREPARE";
    break;
  case 0x45:
    pcVar1 = "VACUUM";
    break;
  case 0x46:
    pcVar1 = "EXPORT";
    break;
  case 0x47:
    pcVar1 = "SET";
    break;
  case 0x48:
    pcVar1 = "SET_VARIABLE";
    break;
  case 0x49:
    pcVar1 = "LOAD";
    break;
  case 0x4a:
    pcVar1 = "INOUT_FUNCTION";
    break;
  case 0x4b:
    pcVar1 = "RESULT_COLLECTOR";
    break;
  case 0x4c:
    pcVar1 = "RESET";
    break;
  case 0x4d:
    pcVar1 = "EXTENSION";
    break;
  case 0x4e:
    pcVar1 = "VERIFY_VECTOR";
    break;
  case 0x4f:
    pcVar1 = "UPDATE_EXTENSIONS";
    break;
  case 0x50:
    pcVar1 = "CREATE_SECRET";
    break;
  default:
    pcVar1 = "INVALID";
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_9);
  return __return_storage_ptr__;
}

Assistant:

string PhysicalOperatorToString(PhysicalOperatorType type) {
	switch (type) {
	case PhysicalOperatorType::TABLE_SCAN:
		return "TABLE_SCAN";
	case PhysicalOperatorType::DUMMY_SCAN:
		return "DUMMY_SCAN";
	case PhysicalOperatorType::CHUNK_SCAN:
		return "CHUNK_SCAN";
	case PhysicalOperatorType::COLUMN_DATA_SCAN:
		return "COLUMN_DATA_SCAN";
	case PhysicalOperatorType::DELIM_SCAN:
		return "DELIM_SCAN";
	case PhysicalOperatorType::ORDER_BY:
		return "ORDER_BY";
	case PhysicalOperatorType::LIMIT:
		return "LIMIT";
	case PhysicalOperatorType::LIMIT_PERCENT:
		return "LIMIT_PERCENT";
	case PhysicalOperatorType::STREAMING_LIMIT:
		return "STREAMING_LIMIT";
	case PhysicalOperatorType::RESERVOIR_SAMPLE:
		return "RESERVOIR_SAMPLE";
	case PhysicalOperatorType::STREAMING_SAMPLE:
		return "STREAMING_SAMPLE";
	case PhysicalOperatorType::TOP_N:
		return "TOP_N";
	case PhysicalOperatorType::WINDOW:
		return "WINDOW";
	case PhysicalOperatorType::STREAMING_WINDOW:
		return "STREAMING_WINDOW";
	case PhysicalOperatorType::UNNEST:
		return "UNNEST";
	case PhysicalOperatorType::UNGROUPED_AGGREGATE:
		return "UNGROUPED_AGGREGATE";
	case PhysicalOperatorType::HASH_GROUP_BY:
		return "HASH_GROUP_BY";
	case PhysicalOperatorType::PERFECT_HASH_GROUP_BY:
		return "PERFECT_HASH_GROUP_BY";
	case PhysicalOperatorType::PARTITIONED_AGGREGATE:
		return "PARTITIONED_AGGREGATE";
	case PhysicalOperatorType::FILTER:
		return "FILTER";
	case PhysicalOperatorType::PROJECTION:
		return "PROJECTION";
	case PhysicalOperatorType::COPY_TO_FILE:
		return "COPY_TO_FILE";
	case PhysicalOperatorType::BATCH_COPY_TO_FILE:
		return "BATCH_COPY_TO_FILE";
	case PhysicalOperatorType::LEFT_DELIM_JOIN:
		return "LEFT_DELIM_JOIN";
	case PhysicalOperatorType::RIGHT_DELIM_JOIN:
		return "RIGHT_DELIM_JOIN";
	case PhysicalOperatorType::BLOCKWISE_NL_JOIN:
		return "BLOCKWISE_NL_JOIN";
	case PhysicalOperatorType::NESTED_LOOP_JOIN:
		return "NESTED_LOOP_JOIN";
	case PhysicalOperatorType::HASH_JOIN:
		return "HASH_JOIN";
	case PhysicalOperatorType::PIECEWISE_MERGE_JOIN:
		return "PIECEWISE_MERGE_JOIN";
	case PhysicalOperatorType::IE_JOIN:
		return "IE_JOIN";
	case PhysicalOperatorType::ASOF_JOIN:
		return "ASOF_JOIN";
	case PhysicalOperatorType::CROSS_PRODUCT:
		return "CROSS_PRODUCT";
	case PhysicalOperatorType::POSITIONAL_JOIN:
		return "POSITIONAL_JOIN";
	case PhysicalOperatorType::POSITIONAL_SCAN:
		return "POSITIONAL_SCAN";
	case PhysicalOperatorType::UNION:
		return "UNION";
	case PhysicalOperatorType::INSERT:
		return "INSERT";
	case PhysicalOperatorType::BATCH_INSERT:
		return "BATCH_INSERT";
	case PhysicalOperatorType::DELETE_OPERATOR:
		return "DELETE";
	case PhysicalOperatorType::UPDATE:
		return "UPDATE";
	case PhysicalOperatorType::EMPTY_RESULT:
		return "EMPTY_RESULT";
	case PhysicalOperatorType::CREATE_TABLE:
		return "CREATE_TABLE";
	case PhysicalOperatorType::CREATE_TABLE_AS:
		return "CREATE_TABLE_AS";
	case PhysicalOperatorType::BATCH_CREATE_TABLE_AS:
		return "BATCH_CREATE_TABLE_AS";
	case PhysicalOperatorType::CREATE_INDEX:
		return "CREATE_INDEX";
	case PhysicalOperatorType::EXPLAIN:
		return "EXPLAIN";
	case PhysicalOperatorType::EXPLAIN_ANALYZE:
		return "EXPLAIN_ANALYZE";
	case PhysicalOperatorType::EXECUTE:
		return "EXECUTE";
	case PhysicalOperatorType::VACUUM:
		return "VACUUM";
	case PhysicalOperatorType::RECURSIVE_CTE:
		return "REC_CTE";
	case PhysicalOperatorType::RECURSIVE_KEY_CTE:
		return "REC_KEY_CTE";
	case PhysicalOperatorType::CTE:
		return "CTE";
	case PhysicalOperatorType::RECURSIVE_CTE_SCAN:
		return "REC_CTE_SCAN";
	case PhysicalOperatorType::RECURSIVE_RECURRING_CTE_SCAN:
		return "REC_REC_CTE_SCAN";
	case PhysicalOperatorType::CTE_SCAN:
		return "CTE_SCAN";
	case PhysicalOperatorType::EXPRESSION_SCAN:
		return "EXPRESSION_SCAN";
	case PhysicalOperatorType::ALTER:
		return "ALTER";
	case PhysicalOperatorType::CREATE_SEQUENCE:
		return "CREATE_SEQUENCE";
	case PhysicalOperatorType::CREATE_VIEW:
		return "CREATE_VIEW";
	case PhysicalOperatorType::CREATE_SCHEMA:
		return "CREATE_SCHEMA";
	case PhysicalOperatorType::CREATE_MACRO:
		return "CREATE_MACRO";
	case PhysicalOperatorType::CREATE_SECRET:
		return "CREATE_SECRET";
	case PhysicalOperatorType::DROP:
		return "DROP";
	case PhysicalOperatorType::PRAGMA:
		return "PRAGMA";
	case PhysicalOperatorType::TRANSACTION:
		return "TRANSACTION";
	case PhysicalOperatorType::PREPARE:
		return "PREPARE";
	case PhysicalOperatorType::EXPORT:
		return "EXPORT";
	case PhysicalOperatorType::SET:
		return "SET";
	case PhysicalOperatorType::SET_VARIABLE:
		return "SET_VARIABLE";
	case PhysicalOperatorType::RESET:
		return "RESET";
	case PhysicalOperatorType::LOAD:
		return "LOAD";
	case PhysicalOperatorType::INOUT_FUNCTION:
		return "INOUT_FUNCTION";
	case PhysicalOperatorType::CREATE_TYPE:
		return "CREATE_TYPE";
	case PhysicalOperatorType::ATTACH:
		return "ATTACH";
	case PhysicalOperatorType::DETACH:
		return "DETACH";
	case PhysicalOperatorType::RESULT_COLLECTOR:
		return "RESULT_COLLECTOR";
	case PhysicalOperatorType::EXTENSION:
		return "EXTENSION";
	case PhysicalOperatorType::PIVOT:
		return "PIVOT";
	case PhysicalOperatorType::COPY_DATABASE:
		return "COPY_DATABASE";
	case PhysicalOperatorType::VERIFY_VECTOR:
		return "VERIFY_VECTOR";
	case PhysicalOperatorType::UPDATE_EXTENSIONS:
		return "UPDATE_EXTENSIONS";
	case PhysicalOperatorType::INVALID:
		break;
	}
	return "INVALID";
}